

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O2

float stbir__filter_mitchell(float x,float s)

{
  float fVar1;
  
  fVar1 = ABS(x);
  if (1.0 <= fVar1) {
    if (2.0 <= fVar1) {
      return 0.0;
    }
    fVar1 = ((fVar1 * -7.0 + 36.0) * fVar1 + -60.0) * fVar1 + 32.0;
  }
  else {
    fVar1 = (fVar1 * 21.0 + -36.0) * x * x + 16.0;
  }
  return fVar1 / 18.0;
}

Assistant:

static float stbir__filter_mitchell(float x, float s)
{
    STBIR__UNUSED_PARAM(s);

    x = (float)fabs(x);

    if (x < 1.0f)
        return (16 + x*x*(21 * x - 36))/18;
    else if (x < 2.0f)
        return (32 + x*(-60 + x*(36 - 7*x)))/18;

    return (0.0f);
}